

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void * new__<Memory::HeapAllocator>
                 (size_t byteSize,HeapAllocator *alloc,bool nothrow,
                 offset_in_HeapAllocator_to_subr AllocFunc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  long *plVar5;
  long in_R8;
  code *local_60;
  void *buffer;
  offset_in_HeapAllocator_to_subr AllocFunc_local;
  bool nothrow_local;
  HeapAllocator *alloc_local;
  size_t byteSize_local;
  
  if (!nothrow) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x224,"(nothrow)","nothrow");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  plVar5 = (long *)((long)&alloc->m_privateHeap + in_R8);
  local_60 = (code *)AllocFunc;
  if ((AllocFunc & 1) != 0) {
    local_60 = *(code **)(*plVar5 + (AllocFunc - 1));
  }
  pvVar4 = (void *)(*local_60)(plVar5,byteSize);
  return pvVar4;
}

Assistant:

__cdecl
operator new[](DECLSPEC_GUARD_OVERFLOW size_t byteSize, TAllocator * alloc, bool nothrow, char * (TAllocator::*AllocFunc)(size_t))
{
    Assert(nothrow);
    Assert(byteSize != 0 || !TAllocator::FakeZeroLengthArray);
    void * buffer = (alloc->*AllocFunc)(byteSize);
    return buffer;
}